

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateFastBrTypeOf
          (Lowerer *this,Instr *branch,RegOpnd *object,IntConstOpnd *typeIdOpnd,Instr *typeOf,
          bool *pfNoLower,bool isNeqOp)

{
  undefined2 uVar1;
  code *pcVar2;
  bool bVar3;
  OpCode OVar4;
  TypeId typeIdToCheck;
  uint32 uVar5;
  BailOutKind BVar6;
  long lVar7;
  BranchInstr *this_00;
  LabelInstr *target_00;
  LabelInstr *target_01;
  RegOpnd *typeOpnd;
  undefined4 *puVar8;
  IndirOpnd *pIVar9;
  RegOpnd *dst;
  Opnd *compareSrc2;
  IntConstOpnd *pIVar10;
  BailOutInfo *bailoutInfo;
  LabelInstr *local_138;
  LabelInstr *local_118;
  LabelInstr *local_e8;
  LabelInstr *local_d0;
  LabelInstr *local_98;
  LabelInstr *local_90;
  RegOpnd *objTypeIdOpnd;
  LabelInstr *label;
  RegOpnd *typeRegOpnd;
  LabelInstr *helper;
  LabelInstr *done;
  LabelInstr *target;
  TypeId typeId;
  bool isNeqOp_local;
  bool *pfNoLower_local;
  Instr *typeOf_local;
  IntConstOpnd *typeIdOpnd_local;
  RegOpnd *object_local;
  Instr *branch_local;
  Lowerer *this_local;
  
  lVar7 = IR::EncodableOpnd<long>::GetValue(&typeIdOpnd->super_EncodableOpnd<long>);
  typeIdToCheck = (TypeId)lVar7;
  this_00 = IR::Instr::AsBranchInstr(branch);
  target_00 = IR::BranchInstr::GetTarget(this_00);
  local_138 = IR::LabelInstr::New(Label,this->m_func,false);
  target_01 = IR::LabelInstr::New(Label,this->m_func,true);
  typeOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  uVar1 = branch->m_opcode;
  if (((1 < (ushort)(uVar1 - 0xc)) && (1 < (ushort)(uVar1 - 0x14))) && (3 < (ushort)(uVar1 - 0x194))
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6289,"((0))","UNREACHED");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  local_90 = local_138;
  if (typeIdToCheck == TypeIds_Number) {
    local_90 = target_00;
  }
  objTypeIdOpnd = (RegOpnd *)local_90;
  if (isNeqOp) {
    local_98 = target_00;
    if (local_90 == target_00) {
      local_98 = local_138;
    }
    objTypeIdOpnd = (RegOpnd *)local_98;
  }
  LowererMD::GenerateObjectTest
            (&this->m_lowererMD,&object->super_Opnd,branch,(LabelInstr *)objTypeIdOpnd,false);
  uVar5 = Js::RecyclableObject::GetOffsetOfType();
  pIVar9 = IR::IndirOpnd::New(object,uVar5,TyInt64,this->m_func,false);
  InsertMove(&typeOpnd->super_Opnd,&pIVar9->super_Opnd,branch,true);
  GenerateFalsyObjectTest(this,branch,typeOpnd,typeIdToCheck,target_00,local_138,isNeqOp);
  dst = IR::RegOpnd::New(TyInt32,this->m_func);
  uVar5 = Js::Type::GetOffsetOfTypeId();
  pIVar9 = IR::IndirOpnd::New(typeOpnd,uVar5,TyInt32,this->m_func,false);
  InsertMove(&dst->super_Opnd,&pIVar9->super_Opnd,branch,true);
  if (typeIdToCheck == TypeIds_Object) {
    local_d0 = target_00;
    if (isNeqOp) {
      local_d0 = local_138;
    }
    InsertCompareBranch(this,&dst->super_Opnd,&typeIdOpnd->super_Opnd,BrGe_A,local_d0,branch,false);
  }
  else if (typeIdToCheck == TypeIds_Function) {
    local_e8 = target_00;
    if (isNeqOp) {
      local_e8 = local_138;
    }
    InsertCompareBranch(this,&dst->super_Opnd,&typeIdOpnd->super_Opnd,BrEq_A,local_e8,branch,false);
  }
  else if (typeIdToCheck == TypeIds_Number) {
    pIVar10 = IR::IntConstOpnd::New(3,TyInt32,branch->m_func,false);
    InsertSub(false,&dst->super_Opnd,&dst->super_Opnd,&pIVar10->super_Opnd,branch);
    pIVar10 = IR::IntConstOpnd::New(3,TyInt32,branch->m_func,false);
    InsertCompare(&dst->super_Opnd,&pIVar10->super_Opnd,branch);
    OVar4 = BrLe_A;
    if (isNeqOp) {
      OVar4 = BrGt_A;
    }
    InsertBranch(OVar4,true,target_00,branch);
  }
  else {
    InsertCompare(&dst->super_Opnd,&typeIdOpnd->super_Opnd,branch);
    OVar4 = BrEq_A;
    if (isNeqOp) {
      OVar4 = BrNeq_A;
    }
    InsertBranch(OVar4,target_00,branch);
  }
  if (typeIdToCheck == TypeIds_Object) {
    compareSrc2 = LoadLibraryValueOpnd(this,branch,ValueNull);
    local_118 = target_00;
    if (isNeqOp) {
      local_118 = local_138;
    }
    InsertCompareBranch(this,&object->super_Opnd,compareSrc2,BrEq_A,local_118,branch,false);
  }
  IR::Instr::InsertAfter(branch,&local_138->super_Instr);
  if ((typeIdToCheck != TypeIds_Object) && (typeIdToCheck != TypeIds_Function)) {
    IR::Instr::Remove(typeOf);
    IR::Instr::Remove(branch);
    *pfNoLower = true;
    return;
  }
  pIVar10 = IR::IntConstOpnd::New(0x1a,TyInt32,this->m_func,false);
  InsertCompareBranch(this,&dst->super_Opnd,&pIVar10->super_Opnd,BrEq_A,target_01,branch,false);
  pIVar10 = IR::IntConstOpnd::New(0x17,TyInt32,this->m_func,false);
  if (isNeqOp) {
    local_138 = target_00;
  }
  InsertCompareBranch(this,&dst->super_Opnd,&pIVar10->super_Opnd,BrNeq_A,local_138,branch,false);
  IR::Instr::InsertBefore(branch,&target_01->super_Instr);
  IR::Instr::Unlink(typeOf);
  IR::Instr::InsertBefore(branch,typeOf);
  bVar3 = IR::Instr::HasBailOutInfo(branch);
  pfNoLower_local = (bool *)typeOf;
  if (bVar3) {
    BVar6 = IR::Instr::GetBailOutKind(branch);
    bVar3 = BailOutInfo::IsBailOutOnImplicitCalls(BVar6);
    if (bVar3) {
      bVar3 = IR::Instr::HasBailOutInfo(typeOf);
      if (bVar3) {
        BVar6 = IR::Instr::GetBailOutKind(typeOf);
        bVar3 = BailOutInfo::IsBailOutOnImplicitCalls(BVar6);
        if (bVar3) goto LAB_007e72ef;
      }
      bailoutInfo = IR::Instr::GetBailOutInfo(branch);
      BVar6 = IR::Instr::GetBailOutKind(branch);
      pfNoLower_local = (bool *)AddBailoutToHelperCallInstr(this,typeOf,bailoutInfo,BVar6,branch);
    }
  }
LAB_007e72ef:
  LowerUnaryHelperMem(this,(Instr *)pfNoLower_local,HelperOp_Typeof,(Opnd *)0x0);
  return;
}

Assistant:

void
Lowerer::GenerateFastBrTypeOf(IR::Instr *branch, IR::RegOpnd *object, IR::IntConstOpnd *typeIdOpnd, IR::Instr *typeOf, bool *pfNoLower, bool isNeqOp)
{
    Js::TypeId      typeId   = static_cast<Js::TypeId>(typeIdOpnd->GetValue());
    IR::LabelInstr *target   = branch->AsBranchInstr()->GetTarget();
    IR::LabelInstr *done     = IR::LabelInstr::New(Js::OpCode::Label, m_func, false);
    IR::LabelInstr *helper = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::RegOpnd    *typeRegOpnd = IR::RegOpnd::New(TyMachReg, m_func);

    switch(branch->m_opcode)
    {
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrNotNeq_A:
        break;
    default:
        Assert(UNREACHED);
        __assume(UNREACHED);
    }
    // JNE/BNE (typeId == Js::TypeIds_Number) ? $target : $done
    IR::LabelInstr *label = (typeId == Js::TypeIds_Number) ? target : done;
    if (isNeqOp)
        label = (label == target) ? done : target;

    m_lowererMD.GenerateObjectTest(object, branch, label);

    // MOV typeRegOpnd, [object + offset(Type)]
    InsertMove(typeRegOpnd,
               IR::IndirOpnd::New(object, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func),
               branch);

    GenerateFalsyObjectTest(branch, typeRegOpnd, typeId, target, done, isNeqOp);

    // MOV objTypeId, [typeRegOpnd + offset(TypeId)]
    IR::RegOpnd* objTypeIdOpnd = IR::RegOpnd::New(TyInt32, m_func);
    InsertMove(objTypeIdOpnd,
               IR::IndirOpnd::New(typeRegOpnd, Js::Type::GetOffsetOfTypeId(), TyInt32, m_func),
               branch);

    // CMP objTypeId, typeId
    // JEQ/JGE $done
    if (typeId == Js::TypeIds_Object)
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, Js::OpCode::BrGe_A, isNeqOp ? done : target, branch);
    }
    else if (typeId == Js::TypeIds_Function)
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, Js::OpCode::BrEq_A, isNeqOp ? done : target, branch);
    }
    else if (typeId == Js::TypeIds_Number)
    {
        //Check for the typeIds between  TypeIds_FirstNumberType <= typeIds <= TypeIds_LastNumberType
        InsertSub(false, objTypeIdOpnd, objTypeIdOpnd, IR::IntConstOpnd::New(Js::TypeIds_FirstNumberType, TyInt32, branch->m_func),branch);

        InsertCompare(objTypeIdOpnd, IR::IntConstOpnd::New(Js::TypeIds_LastNumberType - Js::TypeIds_FirstNumberType, TyInt32, branch->m_func), branch);
        InsertBranch(isNeqOp ? Js::OpCode::BrGt_A : Js::OpCode::BrLe_A, true, target, branch);
    }
    else
    {
        InsertCompare(objTypeIdOpnd, typeIdOpnd, branch);
        InsertBranch(isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, target, branch);
    }

    // This could be 'null' which, for historical reasons, has a TypeId < TypeIds_Object but
    // is still a Javascript "object."
    if (typeId == Js::TypeIds_Object)
    {
        // CMP object, 0xXXXXXXXX
        // JEQ isNeqOp ? $done : $target
        InsertCompareBranch(object,
                            LoadLibraryValueOpnd(branch, LibraryValue::ValueNull),
                            Js::OpCode::BrEq_A,
                            isNeqOp ? done : target,
                            branch);
    }

    branch->InsertAfter(done); // Get this label first

    // "object" or "function" may come from HostDispatch. Needs helper if that's the case.
    if (typeId == Js::TypeIds_Object || typeId == Js::TypeIds_Function)
    {
        // CMP objTypeId, TypeIds_Proxy. typeof proxy could be 'object' or 'function' depends on the target
        // JNE isNeqOp ? $target : $done
        InsertCompareBranch(objTypeIdOpnd,
            IR::IntConstOpnd::New(Js::TypeIds_Proxy, TyInt32, m_func),
            Js::OpCode::BrEq_A,
            helper,
            branch);

        // CMP objTypeId, TypeIds_HostDispatch
        // JNE isNeqOp ? $target : $done
        InsertCompareBranch(objTypeIdOpnd,
                            IR::IntConstOpnd::New(Js::TypeIds_HostDispatch, TyInt32, m_func),
                            Js::OpCode::BrNeq_A,
                            isNeqOp ? target : done,
                            branch);

        // Now emit Typeof and lower it like we would've for the helper call.
        {
            branch->InsertBefore(helper);
            typeOf->Unlink();
            branch->InsertBefore(typeOf);
            if (branch->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(branch->GetBailOutKind()) &&
                (!typeOf->HasBailOutInfo() || !BailOutInfo::IsBailOutOnImplicitCalls(typeOf->GetBailOutKind())))
            {
                typeOf = AddBailoutToHelperCallInstr(typeOf, branch->GetBailOutInfo(), branch->GetBailOutKind(), branch);
            }
            LowerUnaryHelperMem(typeOf, IR::HelperOp_Typeof);
        }
    }
    else // Other primitive types don't need helper
    {
        typeOf->Remove();
        branch->Remove();
        *pfNoLower = true;
    }

    // $done:
}